

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

ArenaAllocator * __thiscall
duckdb::WindowSegmentTreeGlobalState::CreateTreeAllocator(WindowSegmentTreeGlobalState *this)

{
  mutex *__mutex;
  Allocator *args;
  reference this_00;
  type pAVar1;
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> uStack_18;
  
  __mutex = &(this->super_WindowAggregatorGlobalState).lock;
  ::std::mutex::lock(__mutex);
  args = Allocator::DefaultAllocator();
  make_uniq<duckdb::ArenaAllocator,duckdb::Allocator&>((duckdb *)&uStack_18,args);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
              *)&this->tree_allocators,
             (unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)&uStack_18);
  ::std::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_>::
  ~unique_ptr(&uStack_18);
  this_00 = vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
            ::back(&this->tree_allocators);
  pAVar1 = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
           operator*(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pAVar1;
}

Assistant:

ArenaAllocator &CreateTreeAllocator() {
		lock_guard<mutex> tree_lock(lock);
		tree_allocators.emplace_back(make_uniq<ArenaAllocator>(Allocator::DefaultAllocator()));
		return *tree_allocators.back();
	}